

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::TypedefDeclarationSyntax::TypedefDeclarationSyntax
          (TypedefDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token typedefKeyword,
          DataTypeSyntax *type,Token name,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions,Token semi)

{
  bool bVar1;
  DataTypeSyntax *pDVar2;
  reference ppVVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  DataTypeSyntax *in_R8;
  VariableDimensionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *__range2;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_ffffffffffffff88;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *this_00;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *this_01;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb0;
  __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffb8;
  MemberSyntax *in_stack_ffffffffffffffc0;
  DataTypeSyntax *local_38 [2];
  DataTypeSyntax *local_28;
  SyntaxNode *local_10;
  SyntaxNode *local_8;
  
  this_01 = (span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
            &stack0x00000018;
  this_00 = (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&stack0x00000008;
  local_28 = in_R8;
  local_10 = in_RDX;
  local_8 = in_RCX;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffc0,
             (SyntaxKind)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x20),
             in_stack_ffffffffffffffb0);
  in_RDI[3].parent = local_10;
  in_RDI[3].previewNode = local_8;
  local_38[0] = local_28;
  not_null<slang::syntax::DataTypeSyntax_*>::not_null<slang::syntax::DataTypeSyntax_*>
            ((not_null<slang::syntax::DataTypeSyntax_*> *)(in_RDI + 4),local_38);
  in_RDI[4].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[4].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList(this_00,in_stack_ffffffffffffff88);
  in_RDI[7].parent = (SyntaxNode *)this_01->_M_ptr;
  in_RDI[7].previewNode = (SyntaxNode *)(this_01->_M_extent)._M_extent_value;
  pDVar2 = not_null<slang::syntax::DataTypeSyntax_*>::operator->
                     ((not_null<slang::syntax::DataTypeSyntax_*> *)0x526af3);
  (pDVar2->super_ExpressionSyntax).super_SyntaxNode.parent = in_RDI;
  in_RDI[5].previewNode = in_RDI;
  std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff88);
  std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffb8);
    ((*ppVVar3)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::VariableDimensionSyntax_**,_std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffb8);
  }
  return;
}

Assistant:

TypedefDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token typedefKeyword, DataTypeSyntax& type, Token name, const SyntaxList<VariableDimensionSyntax>& dimensions, Token semi) :
        MemberSyntax(SyntaxKind::TypedefDeclaration, attributes), typedefKeyword(typedefKeyword), type(&type), name(name), dimensions(dimensions), semi(semi) {
        this->type->parent = this;
        this->dimensions.parent = this;
        for (auto child : this->dimensions)
            child->parent = this;
    }